

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

void __thiscall
Diligent::TexFormatToViewFormatConverter::TexFormatToViewFormatConverter
          (TexFormatToViewFormatConverter *this)

{
  array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL> *paVar1;
  array<Diligent::TEXTURE_FORMAT,_6UL> *paVar2;
  
  memset(this,0,0x4f8);
  (this->m_ViewFormats)._M_elems[1]._M_elems[0] = TEX_FORMAT_RGBA32_FLOAT;
  (this->m_ViewFormats)._M_elems[1]._M_elems[1] = TEX_FORMAT_RGBA32_FLOAT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[1]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[1]._M_elems[4] = TEX_FORMAT_RGBA32_FLOAT;
  (this->m_ViewFormats)._M_elems[2]._M_elems[0] = TEX_FORMAT_RGBA32_FLOAT;
  (this->m_ViewFormats)._M_elems[2]._M_elems[1] = TEX_FORMAT_RGBA32_FLOAT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[2]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[2]._M_elems[4] = TEX_FORMAT_RGBA32_FLOAT;
  (this->m_ViewFormats)._M_elems[3]._M_elems[0] = TEX_FORMAT_RGBA32_UINT;
  (this->m_ViewFormats)._M_elems[3]._M_elems[1] = TEX_FORMAT_RGBA32_UINT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[3]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[3]._M_elems[4] = TEX_FORMAT_RGBA32_UINT;
  (this->m_ViewFormats)._M_elems[4]._M_elems[0] = TEX_FORMAT_RGBA32_SINT;
  (this->m_ViewFormats)._M_elems[4]._M_elems[1] = TEX_FORMAT_RGBA32_SINT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[4]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[4]._M_elems[4] = TEX_FORMAT_RGBA32_SINT;
  (this->m_ViewFormats)._M_elems[5]._M_elems[0] = TEX_FORMAT_RGB32_FLOAT;
  (this->m_ViewFormats)._M_elems[5]._M_elems[1] = TEX_FORMAT_RGB32_FLOAT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[5]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[5]._M_elems[4] = TEX_FORMAT_RGB32_FLOAT;
  (this->m_ViewFormats)._M_elems[6]._M_elems[0] = TEX_FORMAT_RGB32_FLOAT;
  (this->m_ViewFormats)._M_elems[6]._M_elems[1] = TEX_FORMAT_RGB32_FLOAT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[6]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[6]._M_elems[4] = TEX_FORMAT_RGB32_FLOAT;
  (this->m_ViewFormats)._M_elems[7]._M_elems[0] = TEX_FORMAT_RGB32_UINT;
  (this->m_ViewFormats)._M_elems[7]._M_elems[1] = TEX_FORMAT_RGB32_UINT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[7]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[7]._M_elems[4] = TEX_FORMAT_RGB32_UINT;
  (this->m_ViewFormats)._M_elems[8]._M_elems[0] = TEX_FORMAT_RGB32_SINT;
  (this->m_ViewFormats)._M_elems[8]._M_elems[1] = TEX_FORMAT_RGB32_SINT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[8]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[8]._M_elems[4] = TEX_FORMAT_RGB32_SINT;
  (this->m_ViewFormats)._M_elems[9]._M_elems[0] = TEX_FORMAT_RGBA16_FLOAT;
  (this->m_ViewFormats)._M_elems[9]._M_elems[1] = TEX_FORMAT_RGBA16_FLOAT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[9]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[9]._M_elems[4] = TEX_FORMAT_RGBA16_FLOAT;
  (this->m_ViewFormats)._M_elems[10]._M_elems[0] = TEX_FORMAT_RGBA16_FLOAT;
  (this->m_ViewFormats)._M_elems[10]._M_elems[1] = TEX_FORMAT_RGBA16_FLOAT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[10]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[10]._M_elems[4] = TEX_FORMAT_RGBA16_FLOAT;
  (this->m_ViewFormats)._M_elems[0xb]._M_elems[0] = TEX_FORMAT_RGBA16_UNORM;
  (this->m_ViewFormats)._M_elems[0xb]._M_elems[1] = TEX_FORMAT_RGBA16_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0xb]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0xb]._M_elems[4] = TEX_FORMAT_RGBA16_UNORM;
  (this->m_ViewFormats)._M_elems[0xc]._M_elems[0] = TEX_FORMAT_RGBA16_UINT;
  (this->m_ViewFormats)._M_elems[0xc]._M_elems[1] = TEX_FORMAT_RGBA16_UINT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0xc]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0xc]._M_elems[4] = TEX_FORMAT_RGBA16_UINT;
  (this->m_ViewFormats)._M_elems[0xd]._M_elems[0] = TEX_FORMAT_RGBA16_SNORM;
  (this->m_ViewFormats)._M_elems[0xd]._M_elems[1] = TEX_FORMAT_RGBA16_SNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0xd]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0xd]._M_elems[4] = TEX_FORMAT_RGBA16_SNORM;
  (this->m_ViewFormats)._M_elems[0xe]._M_elems[0] = TEX_FORMAT_RGBA16_SINT;
  (this->m_ViewFormats)._M_elems[0xe]._M_elems[1] = TEX_FORMAT_RGBA16_SINT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0xe]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0xe]._M_elems[4] = TEX_FORMAT_RGBA16_SINT;
  (this->m_ViewFormats)._M_elems[0xf]._M_elems[0] = TEX_FORMAT_RG32_FLOAT;
  (this->m_ViewFormats)._M_elems[0xf]._M_elems[1] = TEX_FORMAT_RG32_FLOAT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0xf]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0xf]._M_elems[4] = TEX_FORMAT_RG32_FLOAT;
  (this->m_ViewFormats)._M_elems[0x10]._M_elems[0] = TEX_FORMAT_RG32_FLOAT;
  (this->m_ViewFormats)._M_elems[0x10]._M_elems[1] = TEX_FORMAT_RG32_FLOAT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x10]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x10]._M_elems[4] = TEX_FORMAT_RG32_FLOAT;
  (this->m_ViewFormats)._M_elems[0x11]._M_elems[0] = TEX_FORMAT_RG32_UINT;
  (this->m_ViewFormats)._M_elems[0x11]._M_elems[1] = TEX_FORMAT_RG32_UINT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x11]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x11]._M_elems[4] = TEX_FORMAT_RG32_UINT;
  (this->m_ViewFormats)._M_elems[0x12]._M_elems[0] = TEX_FORMAT_RG32_SINT;
  (this->m_ViewFormats)._M_elems[0x12]._M_elems[1] = TEX_FORMAT_RG32_SINT;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x12]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x12]._M_elems[4] = TEX_FORMAT_RG32_SINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x13]._M_elems[0] = TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS;
  paVar1->_M_elems[0x13]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x13]._M_elems[2] = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  paVar1->_M_elems[0x13]._M_elems[3] = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  (this->m_ViewFormats)._M_elems[0x13]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x14]._M_elems[0] = TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS;
  paVar1->_M_elems[0x14]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x14]._M_elems[2] = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  paVar1->_M_elems[0x14]._M_elems[3] = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  (this->m_ViewFormats)._M_elems[0x14]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x15]._M_elems[0] = TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS;
  paVar1->_M_elems[0x15]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x15]._M_elems[2] = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  paVar1->_M_elems[0x15]._M_elems[3] = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  (this->m_ViewFormats)._M_elems[0x15]._M_elems[4] = TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x16]._M_elems[0] = TEX_FORMAT_X32_TYPELESS_G8X24_UINT;
  paVar1->_M_elems[0x16]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x16]._M_elems[2] = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  paVar1->_M_elems[0x16]._M_elems[3] = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  (this->m_ViewFormats)._M_elems[0x16]._M_elems[4] = TEX_FORMAT_X32_TYPELESS_G8X24_UINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x17]._M_elems[0] = TEX_FORMAT_RGB10A2_UNORM;
  paVar1->_M_elems[0x17]._M_elems[1] = TEX_FORMAT_RGB10A2_UNORM;
  paVar1->_M_elems[0x17]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x17]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x17]._M_elems[4] = TEX_FORMAT_RGB10A2_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x18]._M_elems[0] = TEX_FORMAT_RGB10A2_UNORM;
  paVar1->_M_elems[0x18]._M_elems[1] = TEX_FORMAT_RGB10A2_UNORM;
  paVar1->_M_elems[0x18]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x18]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x18]._M_elems[4] = TEX_FORMAT_RGB10A2_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x19]._M_elems[0] = TEX_FORMAT_RGB10A2_UINT;
  paVar1->_M_elems[0x19]._M_elems[1] = TEX_FORMAT_RGB10A2_UINT;
  paVar1->_M_elems[0x19]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x19]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x19]._M_elems[4] = TEX_FORMAT_RGB10A2_UINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x1a]._M_elems[0] = TEX_FORMAT_R11G11B10_FLOAT;
  paVar1->_M_elems[0x1a]._M_elems[1] = TEX_FORMAT_R11G11B10_FLOAT;
  paVar1->_M_elems[0x1a]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x1a]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x1a]._M_elems[4] = TEX_FORMAT_R11G11B10_FLOAT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x1b]._M_elems[0] = TEX_FORMAT_RGBA8_UNORM;
  paVar1->_M_elems[0x1b]._M_elems[1] = TEX_FORMAT_RGBA8_UNORM;
  paVar1->_M_elems[0x1b]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x1b]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x1b]._M_elems[4] = TEX_FORMAT_RGBA8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x1c]._M_elems[0] = TEX_FORMAT_RGBA8_UNORM;
  paVar1->_M_elems[0x1c]._M_elems[1] = TEX_FORMAT_RGBA8_UNORM;
  paVar1->_M_elems[0x1c]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x1c]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x1c]._M_elems[4] = TEX_FORMAT_RGBA8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x1d]._M_elems[0] = TEX_FORMAT_RGBA8_UNORM_SRGB;
  paVar1->_M_elems[0x1d]._M_elems[1] = TEX_FORMAT_RGBA8_UNORM_SRGB;
  paVar1->_M_elems[0x1d]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x1d]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x1d]._M_elems[4] = TEX_FORMAT_RGBA8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x1e]._M_elems[0] = TEX_FORMAT_RGBA8_UINT;
  paVar1->_M_elems[0x1e]._M_elems[1] = TEX_FORMAT_RGBA8_UINT;
  paVar1->_M_elems[0x1e]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x1e]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x1e]._M_elems[4] = TEX_FORMAT_RGBA8_UINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x1f]._M_elems[0] = TEX_FORMAT_RGBA8_SNORM;
  paVar1->_M_elems[0x1f]._M_elems[1] = TEX_FORMAT_RGBA8_SNORM;
  paVar1->_M_elems[0x1f]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x1f]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x1f]._M_elems[4] = TEX_FORMAT_RGBA8_SNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x20]._M_elems[0] = TEX_FORMAT_RGBA8_SINT;
  paVar1->_M_elems[0x20]._M_elems[1] = TEX_FORMAT_RGBA8_SINT;
  paVar1->_M_elems[0x20]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x20]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x20]._M_elems[4] = TEX_FORMAT_RGBA8_SINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x21]._M_elems[0] = TEX_FORMAT_RG16_FLOAT;
  paVar1->_M_elems[0x21]._M_elems[1] = TEX_FORMAT_RG16_FLOAT;
  paVar1->_M_elems[0x21]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x21]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x21]._M_elems[4] = TEX_FORMAT_RG16_FLOAT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x22]._M_elems[0] = TEX_FORMAT_RG16_FLOAT;
  paVar1->_M_elems[0x22]._M_elems[1] = TEX_FORMAT_RG16_FLOAT;
  paVar1->_M_elems[0x22]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x22]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x22]._M_elems[4] = TEX_FORMAT_RG16_FLOAT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x23]._M_elems[0] = TEX_FORMAT_RG16_UNORM;
  paVar1->_M_elems[0x23]._M_elems[1] = TEX_FORMAT_RG16_UNORM;
  paVar1->_M_elems[0x23]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x23]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x23]._M_elems[4] = TEX_FORMAT_RG16_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x24]._M_elems[0] = TEX_FORMAT_RG16_UINT;
  paVar1->_M_elems[0x24]._M_elems[1] = TEX_FORMAT_RG16_UINT;
  paVar1->_M_elems[0x24]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x24]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x24]._M_elems[4] = TEX_FORMAT_RG16_UINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x25]._M_elems[0] = TEX_FORMAT_RG16_SNORM;
  paVar1->_M_elems[0x25]._M_elems[1] = TEX_FORMAT_RG16_SNORM;
  paVar1->_M_elems[0x25]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x25]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x25]._M_elems[4] = TEX_FORMAT_RG16_SNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x26]._M_elems[0] = TEX_FORMAT_RG16_SINT;
  paVar1->_M_elems[0x26]._M_elems[1] = TEX_FORMAT_RG16_SINT;
  paVar1->_M_elems[0x26]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x26]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x26]._M_elems[4] = TEX_FORMAT_RG16_SINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x27]._M_elems[0] = TEX_FORMAT_R32_FLOAT;
  paVar1->_M_elems[0x27]._M_elems[1] = TEX_FORMAT_R32_FLOAT;
  paVar1->_M_elems[0x27]._M_elems[2] = TEX_FORMAT_D32_FLOAT;
  paVar1->_M_elems[0x27]._M_elems[3] = TEX_FORMAT_D32_FLOAT;
  (this->m_ViewFormats)._M_elems[0x27]._M_elems[4] = TEX_FORMAT_R32_FLOAT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x28]._M_elems[0] = TEX_FORMAT_R32_FLOAT;
  paVar1->_M_elems[0x28]._M_elems[1] = TEX_FORMAT_R32_FLOAT;
  paVar1->_M_elems[0x28]._M_elems[2] = TEX_FORMAT_D32_FLOAT;
  paVar1->_M_elems[0x28]._M_elems[3] = TEX_FORMAT_D32_FLOAT;
  (this->m_ViewFormats)._M_elems[0x28]._M_elems[4] = TEX_FORMAT_R32_FLOAT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x29]._M_elems[0] = TEX_FORMAT_R32_FLOAT;
  paVar1->_M_elems[0x29]._M_elems[1] = TEX_FORMAT_R32_FLOAT;
  paVar1->_M_elems[0x29]._M_elems[2] = TEX_FORMAT_D32_FLOAT;
  paVar1->_M_elems[0x29]._M_elems[3] = TEX_FORMAT_D32_FLOAT;
  (this->m_ViewFormats)._M_elems[0x29]._M_elems[4] = TEX_FORMAT_R32_FLOAT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x2a]._M_elems[0] = TEX_FORMAT_R32_UINT;
  paVar1->_M_elems[0x2a]._M_elems[1] = TEX_FORMAT_R32_UINT;
  paVar1->_M_elems[0x2a]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x2a]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x2a]._M_elems[4] = TEX_FORMAT_R32_UINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x2b]._M_elems[0] = TEX_FORMAT_R32_SINT;
  paVar1->_M_elems[0x2b]._M_elems[1] = TEX_FORMAT_R32_SINT;
  paVar1->_M_elems[0x2b]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x2b]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x2b]._M_elems[4] = TEX_FORMAT_R32_SINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x2c]._M_elems[0] = TEX_FORMAT_R24_UNORM_X8_TYPELESS;
  paVar1->_M_elems[0x2c]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x2c]._M_elems[2] = TEX_FORMAT_D24_UNORM_S8_UINT;
  paVar1->_M_elems[0x2c]._M_elems[3] = TEX_FORMAT_D24_UNORM_S8_UINT;
  (this->m_ViewFormats)._M_elems[0x2c]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x2d]._M_elems[0] = TEX_FORMAT_R24_UNORM_X8_TYPELESS;
  paVar1->_M_elems[0x2d]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x2d]._M_elems[2] = TEX_FORMAT_D24_UNORM_S8_UINT;
  paVar1->_M_elems[0x2d]._M_elems[3] = TEX_FORMAT_D24_UNORM_S8_UINT;
  (this->m_ViewFormats)._M_elems[0x2d]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x2e]._M_elems[0] = TEX_FORMAT_R24_UNORM_X8_TYPELESS;
  paVar1->_M_elems[0x2e]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x2e]._M_elems[2] = TEX_FORMAT_D24_UNORM_S8_UINT;
  paVar1->_M_elems[0x2e]._M_elems[3] = TEX_FORMAT_D24_UNORM_S8_UINT;
  (this->m_ViewFormats)._M_elems[0x2e]._M_elems[4] = TEX_FORMAT_R24_UNORM_X8_TYPELESS;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x2f]._M_elems[0] = TEX_FORMAT_X24_TYPELESS_G8_UINT;
  paVar1->_M_elems[0x2f]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x2f]._M_elems[2] = TEX_FORMAT_D24_UNORM_S8_UINT;
  paVar1->_M_elems[0x2f]._M_elems[3] = TEX_FORMAT_D24_UNORM_S8_UINT;
  (this->m_ViewFormats)._M_elems[0x2f]._M_elems[4] = TEX_FORMAT_X24_TYPELESS_G8_UINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x30]._M_elems[0] = TEX_FORMAT_RG8_UNORM;
  paVar1->_M_elems[0x30]._M_elems[1] = TEX_FORMAT_RG8_UNORM;
  paVar1->_M_elems[0x30]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x30]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x30]._M_elems[4] = TEX_FORMAT_RG8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x31]._M_elems[0] = TEX_FORMAT_RG8_UNORM;
  paVar1->_M_elems[0x31]._M_elems[1] = TEX_FORMAT_RG8_UNORM;
  paVar1->_M_elems[0x31]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x31]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x31]._M_elems[4] = TEX_FORMAT_RG8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x32]._M_elems[0] = TEX_FORMAT_RG8_UINT;
  paVar1->_M_elems[0x32]._M_elems[1] = TEX_FORMAT_RG8_UINT;
  paVar1->_M_elems[0x32]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x32]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x32]._M_elems[4] = TEX_FORMAT_RG8_UINT;
  *(char **)(this->m_ViewFormats)._M_elems[0x33]._M_elems = "er() failed";
  (this->m_ViewFormats)._M_elems[0x33]._M_elems[4] = TEX_FORMAT_RG8_SNORM;
  *(char **)(this->m_ViewFormats)._M_elems[0x34]._M_elems = "llocatorEEE";
  (this->m_ViewFormats)._M_elems[0x34]._M_elems[4] = TEX_FORMAT_RG8_SINT;
  *(char **)(this->m_ViewFormats)._M_elems[0x35]._M_elems = "ET.";
  (this->m_ViewFormats)._M_elems[0x35]._M_elems[4] = TEX_FORMAT_R16_FLOAT;
  *(char **)(this->m_ViewFormats)._M_elems[0x36]._M_elems = "ET.";
  (this->m_ViewFormats)._M_elems[0x36]._M_elems[4] = TEX_FORMAT_R16_FLOAT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x37]._M_elems[0] = TEX_FORMAT_R16_UNORM;
  paVar1->_M_elems[0x37]._M_elems[1] = TEX_FORMAT_R16_UNORM;
  paVar1->_M_elems[0x37]._M_elems[2] = TEX_FORMAT_D16_UNORM;
  paVar1->_M_elems[0x37]._M_elems[3] = TEX_FORMAT_D16_UNORM;
  (this->m_ViewFormats)._M_elems[0x37]._M_elems[4] = TEX_FORMAT_R16_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x38]._M_elems[0] = TEX_FORMAT_R16_UNORM;
  paVar1->_M_elems[0x38]._M_elems[1] = TEX_FORMAT_R16_UNORM;
  paVar1->_M_elems[0x38]._M_elems[2] = TEX_FORMAT_D16_UNORM;
  paVar1->_M_elems[0x38]._M_elems[3] = TEX_FORMAT_D16_UNORM;
  (this->m_ViewFormats)._M_elems[0x38]._M_elems[4] = TEX_FORMAT_R16_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x39]._M_elems[0] = TEX_FORMAT_R16_UINT;
  paVar1->_M_elems[0x39]._M_elems[1] = TEX_FORMAT_R16_UINT;
  paVar1->_M_elems[0x39]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x39]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x39]._M_elems[4] = TEX_FORMAT_R16_UINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x3a]._M_elems[0] = TEX_FORMAT_R16_SNORM;
  paVar1->_M_elems[0x3a]._M_elems[1] = TEX_FORMAT_R16_SNORM;
  paVar1->_M_elems[0x3a]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x3a]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x3a]._M_elems[4] = TEX_FORMAT_R16_SNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x3b]._M_elems[0] = TEX_FORMAT_R16_SINT;
  paVar1->_M_elems[0x3b]._M_elems[1] = TEX_FORMAT_R16_SINT;
  paVar1->_M_elems[0x3b]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x3b]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x3b]._M_elems[4] = TEX_FORMAT_R16_SINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x3c]._M_elems[0] = TEX_FORMAT_R8_UNORM;
  paVar1->_M_elems[0x3c]._M_elems[1] = TEX_FORMAT_R8_UNORM;
  paVar1->_M_elems[0x3c]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x3c]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x3c]._M_elems[4] = TEX_FORMAT_R8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x3d]._M_elems[0] = TEX_FORMAT_R8_UNORM;
  paVar1->_M_elems[0x3d]._M_elems[1] = TEX_FORMAT_R8_UNORM;
  paVar1->_M_elems[0x3d]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x3d]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x3d]._M_elems[4] = TEX_FORMAT_R8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x3e]._M_elems[0] = TEX_FORMAT_R8_UINT;
  paVar1->_M_elems[0x3e]._M_elems[1] = TEX_FORMAT_R8_UINT;
  paVar1->_M_elems[0x3e]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x3e]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x3e]._M_elems[4] = TEX_FORMAT_R8_UINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x3f]._M_elems[0] = TEX_FORMAT_R8_SNORM;
  paVar1->_M_elems[0x3f]._M_elems[1] = TEX_FORMAT_R8_SNORM;
  paVar1->_M_elems[0x3f]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x3f]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x3f]._M_elems[4] = TEX_FORMAT_R8_SNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x40]._M_elems[0] = TEX_FORMAT_R8_SINT;
  paVar1->_M_elems[0x40]._M_elems[1] = TEX_FORMAT_R8_SINT;
  paVar1->_M_elems[0x40]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x40]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x40]._M_elems[4] = TEX_FORMAT_R8_SINT;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x41]._M_elems[0] = TEX_FORMAT_A8_UNORM;
  paVar1->_M_elems[0x41]._M_elems[1] = TEX_FORMAT_A8_UNORM;
  paVar1->_M_elems[0x41]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x41]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x41]._M_elems[4] = TEX_FORMAT_A8_UNORM;
  *(dwfenc **)(this->m_ViewFormats)._M_elems[0x42]._M_elems = &DAT_00420042;
  (this->m_ViewFormats)._M_elems[0x42]._M_elems[4] = TEX_FORMAT_R1_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x43]._M_elems[0] = TEX_FORMAT_RGB9E5_SHAREDEXP;
  paVar1->_M_elems[0x43]._M_elems[1] = TEX_FORMAT_RGB9E5_SHAREDEXP;
  paVar1->_M_elems[0x43]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x43]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x43]._M_elems[4] = TEX_FORMAT_RGB9E5_SHAREDEXP;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x44]._M_elems[0] = TEX_FORMAT_RG8_B8G8_UNORM;
  paVar1->_M_elems[0x44]._M_elems[1] = TEX_FORMAT_RG8_B8G8_UNORM;
  paVar1->_M_elems[0x44]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x44]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x44]._M_elems[4] = TEX_FORMAT_RG8_B8G8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x45]._M_elems[0] = TEX_FORMAT_G8R8_G8B8_UNORM;
  paVar1->_M_elems[0x45]._M_elems[1] = TEX_FORMAT_G8R8_G8B8_UNORM;
  paVar1->_M_elems[0x45]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x45]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x45]._M_elems[4] = TEX_FORMAT_G8R8_G8B8_UNORM;
  (this->m_ViewFormats)._M_elems[0x46]._M_elems[0] = TEX_FORMAT_BC1_UNORM_SRGB;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x46]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x46]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x46]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x46]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x47]._M_elems[0] = TEX_FORMAT_BC1_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x47]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x47]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x47]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x47]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x48]._M_elems[0] = TEX_FORMAT_BC1_UNORM_SRGB;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x48]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x48]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x48]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x48]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x49]._M_elems[0] = TEX_FORMAT_BC2_UNORM_SRGB;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x49]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x49]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x49]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x49]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x4a]._M_elems[0] = TEX_FORMAT_BC2_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x4a]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4a]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4a]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4a]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x4b]._M_elems[0] = TEX_FORMAT_BC2_UNORM_SRGB;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x4b]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4b]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4b]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4b]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x4c]._M_elems[0] = TEX_FORMAT_BC3_UNORM_SRGB;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x4c]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4c]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4c]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4c]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x4d]._M_elems[0] = TEX_FORMAT_BC3_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x4d]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4d]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4d]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4d]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x4e]._M_elems[0] = TEX_FORMAT_BC3_UNORM_SRGB;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x4e]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4e]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4e]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4e]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x4f]._M_elems[0] = TEX_FORMAT_BC4_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x4f]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4f]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4f]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x4f]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x50]._M_elems[0] = TEX_FORMAT_BC4_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x50]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x50]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x50]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x50]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x51]._M_elems[0] = TEX_FORMAT_BC4_SNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x51]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x51]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x51]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x51]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x52]._M_elems[0] = TEX_FORMAT_BC5_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x52]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x52]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x52]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x52]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x53]._M_elems[0] = TEX_FORMAT_BC5_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x53]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x53]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x53]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x53]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x54]._M_elems[0] = TEX_FORMAT_BC5_SNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x54]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x54]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x54]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x54]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x55]._M_elems[0] = TEX_FORMAT_B5G6R5_UNORM;
  paVar1->_M_elems[0x55]._M_elems[1] = TEX_FORMAT_B5G6R5_UNORM;
  paVar1->_M_elems[0x55]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x55]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x55]._M_elems[4] = TEX_FORMAT_B5G6R5_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x56]._M_elems[0] = TEX_FORMAT_B5G5R5A1_UNORM;
  paVar1->_M_elems[0x56]._M_elems[1] = TEX_FORMAT_B5G5R5A1_UNORM;
  paVar1->_M_elems[0x56]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x56]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x56]._M_elems[4] = TEX_FORMAT_B5G5R5A1_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x57]._M_elems[0] = TEX_FORMAT_BGRA8_UNORM;
  paVar1->_M_elems[0x57]._M_elems[1] = TEX_FORMAT_BGRA8_UNORM;
  paVar1->_M_elems[0x57]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x57]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x57]._M_elems[4] = TEX_FORMAT_BGRA8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x58]._M_elems[0] = TEX_FORMAT_BGRX8_UNORM;
  paVar1->_M_elems[0x58]._M_elems[1] = TEX_FORMAT_BGRX8_UNORM;
  paVar1->_M_elems[0x58]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x58]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x58]._M_elems[4] = TEX_FORMAT_BGRX8_UNORM;
  (this->m_ViewFormats)._M_elems[0x59]._M_elems[0] = TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x59]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x59]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x59]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x59]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x5a]._M_elems[0] = TEX_FORMAT_BGRA8_UNORM;
  paVar1->_M_elems[0x5a]._M_elems[1] = TEX_FORMAT_BGRA8_UNORM;
  paVar1->_M_elems[0x5a]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x5a]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x5a]._M_elems[4] = TEX_FORMAT_BGRA8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x5b]._M_elems[0] = TEX_FORMAT_BGRA8_UNORM_SRGB;
  paVar1->_M_elems[0x5b]._M_elems[1] = TEX_FORMAT_BGRA8_UNORM_SRGB;
  paVar1->_M_elems[0x5b]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x5b]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x5b]._M_elems[4] = TEX_FORMAT_BGRA8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x5c]._M_elems[0] = TEX_FORMAT_BGRX8_UNORM_SRGB;
  paVar1->_M_elems[0x5c]._M_elems[1] = TEX_FORMAT_BGRX8_UNORM_SRGB;
  paVar1->_M_elems[0x5c]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x5c]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x5c]._M_elems[4] = TEX_FORMAT_BGRX8_UNORM;
  paVar1 = &this->m_ViewFormats;
  paVar1->_M_elems[0x5d]._M_elems[0] = TEX_FORMAT_BGRX8_UNORM_SRGB;
  paVar1->_M_elems[0x5d]._M_elems[1] = TEX_FORMAT_BGRX8_UNORM_SRGB;
  paVar1->_M_elems[0x5d]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar1->_M_elems[0x5d]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x5d]._M_elems[4] = TEX_FORMAT_BGRX8_UNORM;
  (this->m_ViewFormats)._M_elems[0x5e]._M_elems[0] = TEX_FORMAT_BC6H_UF16;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x5e]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x5e]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x5e]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x5e]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x5f]._M_elems[0] = TEX_FORMAT_BC6H_UF16;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x5f]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x5f]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x5f]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x5f]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x60]._M_elems[0] = TEX_FORMAT_BC6H_SF16;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x60]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x60]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x60]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x60]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x61]._M_elems[0] = TEX_FORMAT_BC7_UNORM_SRGB;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x61]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x61]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x61]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x61]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x62]._M_elems[0] = TEX_FORMAT_BC7_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x62]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x62]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x62]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x62]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[99]._M_elems[0] = TEX_FORMAT_BC7_UNORM_SRGB;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[99]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[99]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[99]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[99]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[100]._M_elems[0] = TEX_FORMAT_ETC2_RGB8_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[100]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[100]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[100]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[100]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x65]._M_elems[0] = TEX_FORMAT_ETC2_RGB8_UNORM_SRGB;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x65]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x65]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x65]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x65]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x66]._M_elems[0] = TEX_FORMAT_ETC2_RGB8A1_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x66]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x66]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x66]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x66]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x67]._M_elems[0] = TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x67]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x67]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x67]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x67]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x68]._M_elems[0] = TEX_FORMAT_ETC2_RGBA8_UNORM;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x68]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x68]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x68]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x68]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x69]._M_elems[0] = TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;
  paVar2 = (this->m_ViewFormats)._M_elems;
  paVar2[0x69]._M_elems[1] = TEX_FORMAT_UNKNOWN;
  paVar2[0x69]._M_elems[2] = TEX_FORMAT_UNKNOWN;
  paVar2[0x69]._M_elems[3] = TEX_FORMAT_UNKNOWN;
  paVar2[0x69]._M_elems[4] = TEX_FORMAT_UNKNOWN;
  (this->m_ViewFormats)._M_elems[0x3c]._M_elems[5] = TEX_FORMAT_R8_UINT;
  (this->m_ViewFormats)._M_elems[0x3e]._M_elems[5] = TEX_FORMAT_R8_UINT;
  (this->m_ViewFormats)._M_elems[0x30]._M_elems[5] = TEX_FORMAT_RG8_UNORM;
  (this->m_ViewFormats)._M_elems[0x31]._M_elems[5] = TEX_FORMAT_RG8_UNORM;
  return;
}

Assistant:

TexFormatToViewFormatConverter()
    {
        // clang-format off
#define INIT_TEX_VIEW_FORMAT_INFO(TexFmt, SRVFmt, RTVFmt, DSVFmt, UAVFmt)\
        {\
            m_ViewFormats[TexFmt][TEXTURE_VIEW_SHADER_RESOURCE-1]         = TEX_FORMAT_##SRVFmt; \
            m_ViewFormats[TexFmt][TEXTURE_VIEW_RENDER_TARGET-1]           = TEX_FORMAT_##RTVFmt; \
            m_ViewFormats[TexFmt][TEXTURE_VIEW_DEPTH_STENCIL-1]           = TEX_FORMAT_##DSVFmt; \
            m_ViewFormats[TexFmt][TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL-1] = TEX_FORMAT_##DSVFmt; \
            m_ViewFormats[TexFmt][TEXTURE_VIEW_UNORDERED_ACCESS-1]        = TEX_FORMAT_##UAVFmt; \
        }
        static_assert(TEXTURE_VIEW_NUM_VIEWS == 7, "Please handle the new view type above, if necessary");

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_UNKNOWN,                 UNKNOWN, UNKNOWN, UNKNOWN, UNKNOWN);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA32_TYPELESS,         RGBA32_FLOAT, RGBA32_FLOAT, UNKNOWN, RGBA32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA32_FLOAT,            RGBA32_FLOAT, RGBA32_FLOAT, UNKNOWN, RGBA32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA32_UINT,             RGBA32_UINT,  RGBA32_UINT,  UNKNOWN, RGBA32_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA32_SINT,             RGBA32_SINT,  RGBA32_SINT,  UNKNOWN, RGBA32_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB32_TYPELESS,          RGB32_FLOAT, RGB32_FLOAT, UNKNOWN, RGB32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB32_FLOAT,             RGB32_FLOAT, RGB32_FLOAT, UNKNOWN, RGB32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB32_UINT,              RGB32_UINT,  RGB32_UINT,  UNKNOWN, RGB32_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB32_SINT,              RGB32_SINT,  RGB32_SINT,  UNKNOWN, RGB32_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_TYPELESS,         RGBA16_FLOAT, RGBA16_FLOAT, UNKNOWN, RGBA16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_FLOAT,            RGBA16_FLOAT, RGBA16_FLOAT, UNKNOWN, RGBA16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_UNORM,            RGBA16_UNORM, RGBA16_UNORM, UNKNOWN, RGBA16_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_UINT,             RGBA16_UINT,  RGBA16_UINT,  UNKNOWN, RGBA16_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_SNORM,            RGBA16_SNORM, RGBA16_SNORM, UNKNOWN, RGBA16_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_SINT,             RGBA16_SINT,  RGBA16_SINT,  UNKNOWN, RGBA16_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG32_TYPELESS,           RG32_FLOAT, RG32_FLOAT, UNKNOWN, RG32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG32_FLOAT,              RG32_FLOAT, RG32_FLOAT, UNKNOWN, RG32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG32_UINT,               RG32_UINT,  RG32_UINT,  UNKNOWN, RG32_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG32_SINT,               RG32_SINT,  RG32_SINT,  UNKNOWN, RG32_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32G8X24_TYPELESS,       R32_FLOAT_X8X24_TYPELESS, UNKNOWN, D32_FLOAT_S8X24_UINT, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_D32_FLOAT_S8X24_UINT,    R32_FLOAT_X8X24_TYPELESS, UNKNOWN, D32_FLOAT_S8X24_UINT, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS,R32_FLOAT_X8X24_TYPELESS, UNKNOWN, D32_FLOAT_S8X24_UINT, R32_FLOAT_X8X24_TYPELESS);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_X32_TYPELESS_G8X24_UINT, X32_TYPELESS_G8X24_UINT,  UNKNOWN, D32_FLOAT_S8X24_UINT, X32_TYPELESS_G8X24_UINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB10A2_TYPELESS,        RGB10A2_UNORM, RGB10A2_UNORM, UNKNOWN, RGB10A2_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB10A2_UNORM,           RGB10A2_UNORM, RGB10A2_UNORM, UNKNOWN, RGB10A2_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB10A2_UINT,            RGB10A2_UINT,  RGB10A2_UINT,  UNKNOWN, RGB10A2_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R11G11B10_FLOAT,         R11G11B10_FLOAT, R11G11B10_FLOAT, UNKNOWN, R11G11B10_FLOAT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_TYPELESS,          RGBA8_UNORM,      RGBA8_UNORM,      UNKNOWN, RGBA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_UNORM,             RGBA8_UNORM,      RGBA8_UNORM,      UNKNOWN, RGBA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_UNORM_SRGB,        RGBA8_UNORM_SRGB, RGBA8_UNORM_SRGB, UNKNOWN, RGBA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_UINT,              RGBA8_UINT,       RGBA8_UINT,       UNKNOWN, RGBA8_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_SNORM,             RGBA8_SNORM,      RGBA8_SNORM,      UNKNOWN, RGBA8_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_SINT,              RGBA8_SINT,       RGBA8_SINT,       UNKNOWN, RGBA8_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_TYPELESS,           RG16_FLOAT, RG16_FLOAT, UNKNOWN, RG16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_FLOAT,              RG16_FLOAT, RG16_FLOAT, UNKNOWN, RG16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_UNORM,              RG16_UNORM, RG16_UNORM, UNKNOWN, RG16_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_UINT,               RG16_UINT,  RG16_UINT,  UNKNOWN, RG16_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_SNORM,              RG16_SNORM, RG16_SNORM, UNKNOWN, RG16_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_SINT,               RG16_SINT,  RG16_SINT,  UNKNOWN, RG16_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32_TYPELESS,            R32_FLOAT, R32_FLOAT, D32_FLOAT, R32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_D32_FLOAT,               R32_FLOAT, R32_FLOAT, D32_FLOAT, R32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32_FLOAT,               R32_FLOAT, R32_FLOAT, D32_FLOAT, R32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32_UINT,                R32_UINT,  R32_UINT,  UNKNOWN,   R32_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32_SINT,                R32_SINT,  R32_SINT,  UNKNOWN,   R32_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R24G8_TYPELESS,          R24_UNORM_X8_TYPELESS, UNKNOWN, D24_UNORM_S8_UINT, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_D24_UNORM_S8_UINT,       R24_UNORM_X8_TYPELESS, UNKNOWN, D24_UNORM_S8_UINT, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R24_UNORM_X8_TYPELESS,   R24_UNORM_X8_TYPELESS, UNKNOWN, D24_UNORM_S8_UINT, R24_UNORM_X8_TYPELESS);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_X24_TYPELESS_G8_UINT,    X24_TYPELESS_G8_UINT,  UNKNOWN, D24_UNORM_S8_UINT, X24_TYPELESS_G8_UINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_TYPELESS,            RG8_UNORM, RG8_UNORM, UNKNOWN, RG8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_UNORM,               RG8_UNORM, RG8_UNORM, UNKNOWN, RG8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_UINT,                RG8_UINT,  RG8_UINT,  UNKNOWN, RG8_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_SNORM,               RG8_SNORM, RG8_SNORM, UNKNOWN, RG8_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_SINT,                RG8_SINT,  RG8_SINT,  UNKNOWN, RG8_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_TYPELESS,            R16_FLOAT, R16_FLOAT, UNKNOWN,   R16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_FLOAT,               R16_FLOAT, R16_FLOAT, UNKNOWN,   R16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_D16_UNORM,               R16_UNORM, R16_UNORM, D16_UNORM, R16_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_UNORM,               R16_UNORM, R16_UNORM, D16_UNORM, R16_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_UINT,                R16_UINT,  R16_UINT,  UNKNOWN,   R16_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_SNORM,               R16_SNORM, R16_SNORM, UNKNOWN,   R16_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_SINT,                R16_SINT,  R16_SINT,  UNKNOWN,   R16_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R8_TYPELESS,             R8_UNORM, R8_UNORM, UNKNOWN, R8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R8_UNORM,                R8_UNORM, R8_UNORM, UNKNOWN, R8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R8_UINT,                 R8_UINT,  R8_UINT,  UNKNOWN, R8_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R8_SNORM,                R8_SNORM, R8_SNORM, UNKNOWN, R8_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R8_SINT,                 R8_SINT,  R8_SINT,  UNKNOWN, R8_SINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_A8_UNORM,                A8_UNORM, A8_UNORM, UNKNOWN, A8_UNORM);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R1_UNORM,                R1_UNORM, R1_UNORM, UNKNOWN, R1_UNORM);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB9E5_SHAREDEXP,        RGB9E5_SHAREDEXP, RGB9E5_SHAREDEXP, UNKNOWN, RGB9E5_SHAREDEXP);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_B8G8_UNORM,          RG8_B8G8_UNORM,  RG8_B8G8_UNORM,  UNKNOWN, RG8_B8G8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_G8R8_G8B8_UNORM,         G8R8_G8B8_UNORM, G8R8_G8B8_UNORM, UNKNOWN, G8R8_G8B8_UNORM);

        // http://www.g-truc.net/post-0335.html
        // http://renderingpipeline.com/2012/07/texture-compression/
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC1_TYPELESS,            BC1_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC1_UNORM,               BC1_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC1_UNORM_SRGB,          BC1_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC2_TYPELESS,            BC2_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC2_UNORM,               BC2_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC2_UNORM_SRGB,          BC2_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC3_TYPELESS,            BC3_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC3_UNORM,               BC3_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC3_UNORM_SRGB,          BC3_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC4_TYPELESS,            BC4_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC4_UNORM,               BC4_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC4_SNORM,               BC4_SNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC5_TYPELESS,            BC5_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC5_UNORM,               BC5_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC5_SNORM,               BC5_SNORM,      UNKNOWN, UNKNOWN, UNKNOWN);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_B5G6R5_UNORM,            B5G6R5_UNORM,   B5G6R5_UNORM,    UNKNOWN, B5G6R5_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_B5G5R5A1_UNORM,          B5G5R5A1_UNORM, B5G5R5A1_UNORM,  UNKNOWN, B5G5R5A1_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRA8_UNORM,             BGRA8_UNORM,    BGRA8_UNORM,     UNKNOWN, BGRA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRX8_UNORM,             BGRX8_UNORM,    BGRX8_UNORM,     UNKNOWN, BGRX8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM, R10G10B10_XR_BIAS_A2_UNORM, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRA8_TYPELESS,          BGRA8_UNORM,      BGRA8_UNORM,      UNKNOWN, BGRA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRA8_UNORM_SRGB,        BGRA8_UNORM_SRGB, BGRA8_UNORM_SRGB, UNKNOWN, BGRA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRX8_TYPELESS,          BGRX8_UNORM_SRGB, BGRX8_UNORM_SRGB, UNKNOWN, BGRX8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRX8_UNORM_SRGB,        BGRX8_UNORM_SRGB, BGRX8_UNORM_SRGB, UNKNOWN, BGRX8_UNORM);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC6H_TYPELESS,           BC6H_UF16,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC6H_UF16,               BC6H_UF16,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC6H_SF16,               BC6H_SF16,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC7_TYPELESS,            BC7_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC7_UNORM,               BC7_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC7_UNORM_SRGB,          BC7_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8_UNORM,         ETC2_RGB8_UNORM,        UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8_UNORM_SRGB,    ETC2_RGB8_UNORM_SRGB,   UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8A1_UNORM,       ETC2_RGB8A1_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB,  ETC2_RGB8A1_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGBA8_UNORM,        ETC2_RGBA8_UNORM,       UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB,   ETC2_RGBA8_UNORM_SRGB,  UNKNOWN, UNKNOWN, UNKNOWN);
#undef INIT_TVIEW_FORMAT_INFO
        // clang-format on

        m_ViewFormats[TEX_FORMAT_R8_TYPELESS][TEXTURE_VIEW_SHADING_RATE - 1]  = TEX_FORMAT_R8_UINT;
        m_ViewFormats[TEX_FORMAT_R8_UINT][TEXTURE_VIEW_SHADING_RATE - 1]      = TEX_FORMAT_R8_UINT;
        m_ViewFormats[TEX_FORMAT_RG8_TYPELESS][TEXTURE_VIEW_SHADING_RATE - 1] = TEX_FORMAT_RG8_UNORM;
        m_ViewFormats[TEX_FORMAT_RG8_UNORM][TEXTURE_VIEW_SHADING_RATE - 1]    = TEX_FORMAT_RG8_UNORM;
    }